

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

void __thiscall
wasm::TranslateToFuzzReader::addInvocations(TranslateToFuzzReader *this,Function *func)

{
  size_t *this_00;
  Module *pMVar1;
  variant<wasm::Name,_wasm::HeapType> value;
  Name name_00;
  Name target;
  bool bVar2;
  long lVar3;
  Block *pBVar4;
  pointer pFVar5;
  Name NVar6;
  Name NVar7;
  Name name_01;
  Iterator IVar8;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar9;
  byte local_2b2;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  Function *local_268;
  char *pcStack_260;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> local_250;
  undefined4 local_244;
  Expression *local_240;
  Type local_238;
  uintptr_t local_230;
  size_t local_228;
  char *pcStack_220;
  Call *local_210;
  Expression *invoke;
  Expression *local_200;
  uintptr_t *local_1f8;
  Type *type;
  Iterator __end2;
  Iterator __begin2;
  Type *__range2;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> args;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> invocations;
  FunctionCreationContext context;
  Block *body;
  Type TStack_100;
  pointer local_f8;
  Signature local_f0;
  HeapType local_e0;
  _Head_base<0UL,_wasm::Function_*,_false> local_d8;
  HeapType HStack_d0;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_c8;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> invoker;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined1 auStack_28 [8];
  Name name;
  Function *func_local;
  TranslateToFuzzReader *this_local;
  
  name.super_IString.str._M_str = (char *)func;
  IString::toString_abi_cxx11_(&local_68,(IString *)func);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"_invoker",&local_89);
  std::operator+(&local_48,&local_68,&local_88);
  Name::Name((Name *)auStack_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string((string *)&local_68);
  NVar6.super_IString.str._M_str = (char *)auStack_28;
  NVar6.super_IString.str._M_len = (size_t)this->wasm;
  lVar3 = ::wasm::Module::getFunctionOrNull(NVar6);
  if (lVar3 == 0) {
    invoker._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
         (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
         auStack_28;
    NVar7.super_IString.str._M_str = (char *)auStack_28;
    NVar7.super_IString.str._M_len = (size_t)this->wasm;
    lVar3 = ::wasm::Module::getExportOrNull(NVar7);
    if (lVar3 == 0) {
      local_d8._M_head_impl = (Function *)auStack_28;
      HStack_d0.id = name.super_IString.str._M_len;
      Signature::Signature(&local_f0);
      ::wasm::HeapType::HeapType(&local_e0,local_f0);
      body = (Block *)0x0;
      TStack_100.id = 0;
      local_f8 = (pointer)0x0;
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&body);
      name_01.super_IString.str._M_str = (char *)local_d8._M_head_impl;
      name_01.super_IString.str._M_len = (size_t)&local_c8;
      Builder::makeFunction
                (name_01,HStack_d0,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_e0.id,
                 (Expression *)&body);
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&body);
      pBVar4 = Builder::makeBlock(&this->builder,(Expression *)0x0);
      pFVar5 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         (&local_c8);
      pFVar5->body = (Expression *)pBVar4;
      pFVar5 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get(&local_c8)
      ;
      FunctionCreationContext::FunctionCreationContext
                ((FunctionCreationContext *)
                 &invocations.
                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,this,pFVar5);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 &args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      while( true ) {
        bVar2 = oneIn(this,2);
        local_2b2 = 0;
        if (bVar2) {
          bVar2 = Random::finished(&this->random);
          local_2b2 = bVar2 ^ 0xff;
        }
        if ((local_2b2 & 1) == 0) break;
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range2);
        __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
             (size_t)Function::getParams((Function *)name.super_IString.str._M_str);
        this_00 = &__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                   index;
        IVar8 = Type::begin((Type *)this_00);
        __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)IVar8.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
        ;
        __end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
             (size_t)IVar8.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     parent;
        PVar9 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
                Type::end((Type *)this_00);
        while( true ) {
          __end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)PVar9.index;
          type = PVar9.parent;
          bVar2 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                            ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                             &__end2.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              index,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *
                                    )&type);
          if (!bVar2) break;
          local_1f8 = (uintptr_t *)
                      ::wasm::Type::Iterator::operator*
                                ((Iterator *)
                                 &__end2.
                                  super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                  .index);
          invoke = (Expression *)*local_1f8;
          local_200 = makeConst(this,(Type)invoke);
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                    ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range2,
                     &local_200);
          ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
                    ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                     &__end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                      index);
          PVar9.index = (size_t)__end2.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                                parent;
          PVar9.parent = type;
        }
        local_228 = *(size_t *)name.super_IString.str._M_str;
        pcStack_220 = *(char **)(name.super_IString.str._M_str + 8);
        local_230 = (uintptr_t)Function::getResults((Function *)name.super_IString.str._M_str);
        target.super_IString.str._M_str = pcStack_220;
        target.super_IString.str._M_len = local_228;
        local_210 = Builder::makeCall(&this->builder,target,
                                      (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                       *)&__range2,(Type)local_230,false);
        local_238 = Function::getResults((Function *)name.super_IString.str._M_str);
        bVar2 = Type::isConcrete(&local_238);
        if (bVar2) {
          local_210 = (Call *)Builder::makeDrop(&this->builder,(Expression *)local_210);
        }
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                   &args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&local_210);
        bVar2 = IString::operator_cast_to_bool(&(this->hashMemoryName).super_IString);
        if ((bVar2) && (bVar2 = oneIn(this,2), bVar2)) {
          local_240 = makeMemoryHashLogging(this);
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                    ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                     &args.
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,&local_240);
        }
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range2);
      }
      bVar2 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::empty
                        ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                         &args.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar2) {
        local_244 = 1;
      }
      else {
        ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
        set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                  ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)
                   &pBVar4->list,
                   (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                   &args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ::wasm::Module::addFunction((unique_ptr *)this->wasm);
        if ((this->preserveImportsAndExports & 1U) == 0) {
          pMVar1 = this->wasm;
          local_268 = (Function *)auStack_28;
          pcStack_260 = (char *)name.super_IString.str._M_len;
          std::variant<wasm::Name,wasm::HeapType>::variant<wasm::Name&,void,void,wasm::Name,void>
                    ((variant<wasm::Name,wasm::HeapType> *)&local_280,(Name *)auStack_28);
          name_00.super_IString.str._M_str = pcStack_260;
          name_00.super_IString.str._M_len = (size_t)local_268;
          value.super__Variant_base<wasm::Name,_wasm::HeapType>.
          super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
          super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
          super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
          super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
          super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.
          super_IString.str._M_str = (char *)uStack_278;
          value.super__Variant_base<wasm::Name,_wasm::HeapType>.
          super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
          super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
          super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
          super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
          super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.
          super_IString.str._M_len = local_280;
          value.super__Variant_base<wasm::Name,_wasm::HeapType>.
          super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
          super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
          super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
          super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
          super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._16_8_ = local_270;
          Builder::makeExport((Builder *)&local_250,name_00,value,Function);
          ::wasm::Module::addExport((unique_ptr *)pMVar1);
          std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr(&local_250)
          ;
        }
        local_244 = 0;
      }
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 &args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      FunctionCreationContext::~FunctionCreationContext
                ((FunctionCreationContext *)
                 &invocations.
                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_c8);
    }
  }
  return;
}

Assistant:

void TranslateToFuzzReader::addInvocations(Function* func) {
  Name name = func->name.toString() + std::string("_invoker");
  if (wasm.getFunctionOrNull(name) || wasm.getExportOrNull(name)) {
    return;
  }
  auto invoker = builder.makeFunction(name, Signature(), {});
  Block* body = builder.makeBlock();
  invoker->body = body;
  FunctionCreationContext context(*this, invoker.get());
  std::vector<Expression*> invocations;
  while (oneIn(2) && !random.finished()) {
    std::vector<Expression*> args;
    for (const auto& type : func->getParams()) {
      args.push_back(makeConst(type));
    }
    Expression* invoke = builder.makeCall(func->name, args, func->getResults());
    if (func->getResults().isConcrete()) {
      invoke = builder.makeDrop(invoke);
    }
    invocations.push_back(invoke);
    // log out memory in some cases
    if (hashMemoryName && oneIn(2)) {
      invocations.push_back(makeMemoryHashLogging());
    }
  }
  if (invocations.empty()) {
    return;
  }
  body->list.set(invocations);
  wasm.addFunction(std::move(invoker));

  // Most of the benefit of invocations is lost when we do not add exports for
  // them, but still, they might be called by existing functions.
  if (!preserveImportsAndExports) {
    wasm.addExport(builder.makeExport(name, name, ExternalKind::Function));
  }
}